

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

int Cudd_NextPrime(DdGen *gen,int **cube)

{
  DdNode *pDVar1;
  int iVar2;
  DdNode *pDVar3;
  bool bVar4;
  int local_44;
  int result;
  int length;
  DdManager *dd;
  DdNode *tmp;
  DdNode *prime;
  DdNode *implicant;
  int **cube_local;
  DdGen *gen_local;
  
  _result = gen->manager;
  pDVar1 = gen->node;
  implicant = (DdNode *)cube;
  cube_local = (int **)gen;
  pDVar3 = Cudd_ReadLogicZero(_result);
  if (pDVar1 == pDVar3) {
    *(undefined4 *)((long)cube_local + 0xc) = 0;
  }
  else {
    prime = Cudd_LargestCube(_result,(DdNode *)cube_local[6],&local_44);
    if (prime == (DdNode *)0x0) {
      *(undefined4 *)((long)cube_local + 0xc) = 0;
      return 0;
    }
    *(int *)(((ulong)prime & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)prime & 0xfffffffffffffffe) + 4) + 1;
    tmp = Cudd_bddMakePrime(_result,prime,(DdNode *)cube_local[3]);
    if (tmp == (DdNode *)0x0) {
      Cudd_RecursiveDeref(_result,prime);
      *(undefined4 *)((long)cube_local + 0xc) = 0;
      return 0;
    }
    *(int *)(((ulong)tmp & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)tmp & 0xfffffffffffffffe) + 4) + 1;
    Cudd_RecursiveDeref(_result,prime);
    dd = (DdManager *)Cudd_bddAnd(_result,(DdNode *)cube_local[6],(DdNode *)((ulong)tmp ^ 1));
    if (dd == (DdManager *)0x0) {
      Cudd_RecursiveDeref(_result,tmp);
      *(undefined4 *)((long)cube_local + 0xc) = 0;
      return 0;
    }
    *(int *)(((ulong)dd & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)dd & 0xfffffffffffffffe) + 4) + 1;
    Cudd_RecursiveDeref(_result,(DdNode *)cube_local[6]);
    cube_local[6] = (int *)dd;
    iVar2 = Cudd_BddToCubeArray(_result,tmp,cube_local[2]);
    if (iVar2 == 0) {
      Cudd_RecursiveDeref(_result,tmp);
      *(undefined4 *)((long)cube_local + 0xc) = 0;
      return 0;
    }
    Cudd_RecursiveDeref(_result,tmp);
    *(undefined4 *)((long)cube_local + 0xc) = 1;
  }
  bVar4 = *(int *)((long)cube_local + 0xc) != 0;
  if (bVar4) {
    *(int **)implicant = cube_local[2];
  }
  gen_local._4_4_ = (uint)bVar4;
  return gen_local._4_4_;
}

Assistant:

int
Cudd_NextPrime(
  DdGen *gen,
  int **cube)
{
    DdNode *implicant, *prime, *tmp;
    DdManager *dd = gen->manager;
    int length, result;

    if (gen->node == Cudd_ReadLogicZero(dd)) {
        gen->status = CUDD_GEN_EMPTY;
    } else {
        implicant = Cudd_LargestCube(dd,gen->node,&length);
        if (implicant == NULL) {
            gen->status = CUDD_GEN_EMPTY;
            return(0);
        }
        cuddRef(implicant);
        prime = Cudd_bddMakePrime(dd,implicant,gen->gen.primes.ub);
        if (prime == NULL) {
            Cudd_RecursiveDeref(dd,implicant);
            gen->status = CUDD_GEN_EMPTY;
            return(0);
        }
        cuddRef(prime);
        Cudd_RecursiveDeref(dd,implicant);
        tmp = Cudd_bddAnd(dd,gen->node,Cudd_Not(prime));
        if (tmp == NULL) {
            Cudd_RecursiveDeref(dd,prime);
            gen->status = CUDD_GEN_EMPTY;
            return(0);
        }
        cuddRef(tmp);
        Cudd_RecursiveDeref(dd,gen->node);
        gen->node = tmp;
        result = Cudd_BddToCubeArray(dd,prime,gen->gen.primes.cube);
        if (result == 0) {
            Cudd_RecursiveDeref(dd,prime);
            gen->status = CUDD_GEN_EMPTY;
            return(0);
        }
        Cudd_RecursiveDeref(dd,prime);
        gen->status = CUDD_GEN_NONEMPTY;
    }
    if (gen->status == CUDD_GEN_EMPTY) return(0);
    *cube = gen->gen.primes.cube;
    return(1);

}